

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

uint Catch::rngSeed(void)

{
  uint uVar1;
  long *plVar2;
  
  if (IMutableContext::currentContext == (long *)0x0) {
    IMutableContext::currentContext = (long *)operator_new(0x20);
    *IMutableContext::currentContext = 0;
    IMutableContext::currentContext[1] = 0;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    *IMutableContext::currentContext = (long)&PTR__Context_001bbb90;
    IMutableContext::currentContext[1] = 0;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
  }
  plVar2 = (long *)(**(code **)(*IMutableContext::currentContext + 0x20))();
  uVar1 = (**(code **)(*plVar2 + 0x88))(plVar2);
  return uVar1;
}

Assistant:

unsigned int rngSeed() {
        return getCurrentContext().getConfig()->rngSeed();
    }